

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_math_log(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  
  TVar1 = lj_ir_tonum(J,*J->base);
  if (J->base[1] == 0) {
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x340e0004;
  }
  else {
    TVar2 = lj_ir_tonum(J,J->base[1]);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x340e0005;
    TVar1 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x340e0005;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_knum_u64(J,0x3ff0000000000000);
    (J->fold).ins.field_0.ot = 0x2c0e;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2b0e;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  }
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_log(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_ir_tonum(J, J->base[0]);
  if (J->base[1]) {
#ifdef LUAJIT_NO_LOG2
    uint32_t fpm = IRFPM_LOG;
#else
    uint32_t fpm = IRFPM_LOG2;
#endif
    TRef trb = lj_ir_tonum(J, J->base[1]);
    tr = emitir(IRTN(IR_FPMATH), tr, fpm);
    trb = emitir(IRTN(IR_FPMATH), trb, fpm);
    trb = emitir(IRTN(IR_DIV), lj_ir_knum_one(J), trb);
    tr = emitir(IRTN(IR_MUL), tr, trb);
  } else {
    tr = emitir(IRTN(IR_FPMATH), tr, IRFPM_LOG);
  }
  J->base[0] = tr;
  UNUSED(rd);
}